

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

int __thiscall
Potassco::TheoryData::accept(TheoryData *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  TheoryData *this_00;
  TheoryTerm *pTVar2;
  undefined4 in_register_00000034;
  iterator end;
  iterator it;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Id_t IVar3;
  TheoryData *local_28;
  
  local_28 = (TheoryData *)
             TheoryElement::begin((TheoryElement *)CONCAT44(in_register_00000034,__fd));
  this_00 = (TheoryData *)
            TheoryElement::end((TheoryElement *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  for (; local_28 != this_00; local_28 = (TheoryData *)((long)&local_28->data_ + 4)) {
    bVar1 = doVisitTerm(this_00,(VisitMode)((ulong)this >> 0x20),(Id_t)this);
    if (bVar1) {
      IVar3 = *(Id_t *)&local_28->data_;
      pTVar2 = getTerm(this_00,(Id_t)((ulong)this >> 0x20));
      (**(code **)(*(long *)__addr + 0x10))(__addr,this,IVar3,pTVar2);
    }
  }
  return (int)local_28;
}

Assistant:

void TheoryData::accept(const TheoryElement& e, Visitor& out, VisitMode m) const {
	for (TheoryElement::iterator it = e.begin(), end = e.end(); it != end; ++it) {
		if (doVisitTerm(m, *it)) { out.visit(*this, *it, getTerm(*it)); }
	}
}